

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  LogMessageFatal local_30;
  
  iVar1 = BytesAvailable(this,ptr);
  while( true ) {
    iVar3 = size - iVar1;
    if (iVar3 == 0 || size < iVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,0x1ab,"size > chunk_size");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
    }
    if (this->next_chunk_ == (char *)0x0) {
      return (char *)0x0;
    }
    if (this->limit_ < 0x11) {
      return (char *)0x0;
    }
    pcVar2 = Next(this);
    if (pcVar2 == (char *)0x0) break;
    iVar1 = BytesAvailable(this,pcVar2 + 0x10);
    size = iVar3;
    if (iVar3 <= iVar1) {
      return pcVar2 + 0x10 + iVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* /*p*/, int /*s*/) {});
}